

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O2

void __thiscall Liby::PollerSelect::loop_once(PollerSelect *this,Timestamp *ts)

{
  Channel *pCVar1;
  bool bVar2;
  int iVar3;
  Logger *this_00;
  int *piVar4;
  long lVar5;
  long lVar6;
  fd_set *pfVar7;
  fd_set *pfVar8;
  timeval *__timeout;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  _Any_data local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  timeval local_1c8;
  fd_set rset;
  fd_set wset;
  fd_set eset;
  
  bVar13 = 0;
  Poller::runNextLoopHandlers(&this->super_Poller);
  if (ts == (Timestamp *)0x0) {
    __timeout = (timeval *)0x0;
  }
  else {
    Timestamp::now();
    bVar2 = operator<(ts,(Timestamp *)&rset);
    local_1c8.tv_sec._0_4_ = 0;
    local_1c8.tv_sec._4_4_ = 0;
    local_1c8.tv_usec._0_4_ = 0;
    local_1c8.tv_usec._4_4_ = 0;
    if (!bVar2) {
      operator-((Liby *)&wset,ts,(Timestamp *)&rset);
      local_1c8.tv_sec._0_4_ = (undefined4)wset.fds_bits[0];
      local_1c8.tv_sec._4_4_ = wset.fds_bits[0]._4_4_;
      local_1c8.tv_usec._0_4_ = (undefined4)wset.fds_bits[1];
      local_1c8.tv_usec._4_4_ = wset.fds_bits[1]._4_4_;
    }
    __timeout = &local_1c8;
  }
  lVar6 = 0x10;
  pfVar7 = &this->rset_;
  pfVar8 = (fd_set *)&rset;
  for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar8->fds_bits[0] = pfVar7->fds_bits[0];
    pfVar7 = (fd_set *)((long)pfVar7 + (ulong)bVar13 * -0x10 + 8);
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  pfVar7 = &this->wset_;
  pfVar8 = (fd_set *)&wset;
  for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar8->fds_bits[0] = pfVar7->fds_bits[0];
    pfVar7 = (fd_set *)((long)pfVar7 + (ulong)bVar13 * -0x10 + 8);
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  pfVar7 = &this->eset_;
  pfVar8 = (fd_set *)&eset;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    pfVar8->fds_bits[0] = pfVar7->fds_bits[0];
    pfVar7 = (fd_set *)((long)pfVar7 + (ulong)bVar13 * -0x10 + 8);
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  iVar3 = select(this->maxfd_,(fd_set *)&rset,(fd_set *)&wset,(fd_set *)&eset,__timeout);
  if (iVar3 == -1) {
    this_00 = Logger::getLogger();
    piVar4 = __errno_location();
    strerror(*piVar4);
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  uVar12 = 0;
  while (((long)uVar12 < (long)this->maxfd_ && (0 < iVar3))) {
    local_1e8._8_8_ = 0;
    local_1f0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp:93:33)>
                ::_M_invoke;
    local_208._8_8_ = 0;
    local_1f8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp:93:33)>
                ::_M_manager;
    local_1d8 = 0;
    uStack_1d0 = 0;
    local_208._M_unused._M_object = this;
    local_1e8._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
    pCVar1 = (this->super_Poller).channels_.
             super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
    if (pCVar1 != (Channel *)0x0) {
      uVar11 = uVar12 >> 6 & 0x3ffffff;
      uVar9 = 1L << ((byte)uVar12 & 0x3f);
      if (((ulong)eset.fds_bits[uVar11] >> (uVar12 & 0x3f) & 1) == 0) {
        bVar2 = (rset.fds_bits[uVar11] & uVar9) != 0;
        if (bVar2) {
          Channel::handleReadEvent(pCVar1);
        }
        uVar10 = (uint)bVar2;
        if (((wset.fds_bits[uVar11] & uVar9) != 0) &&
           (pCVar1 = (this->super_Poller).channels_.
                     super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12], pCVar1 != (Channel *)0x0)) {
          uVar10 = 1;
          Channel::handleWritEvent(pCVar1);
        }
        iVar3 = iVar3 - uVar10;
      }
      else {
        Channel::handleErroEvent(pCVar1);
      }
    }
    DeferCaller::~DeferCaller((DeferCaller *)&local_208);
    uVar12 = uVar12 + 1;
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  return;
}

Assistant:

void PollerSelect::loop_once(Timestamp *ts) {
    runNextLoopHandlers();

    struct timeval timeout;
    struct timeval *pto = nullptr;
    if (ts != nullptr) {
        Timestamp now = Timestamp::now();
        if (*ts < now) {
            timeout = {0, 0};
        } else {
            Timestamp inter = *ts - now;
            timeout = {.tv_sec = inter.sec(), .tv_usec = inter.usec()};
        }
        pto = &timeout;
    }

    fd_set rset = rset_;
    fd_set wset = wset_;
    fd_set eset = eset_;

    int nready = ::select(maxfd_, &rset, &wset, &eset, pto);
    errorif(nready == -1, "select: %s", ::strerror(errno));

    for (int fd = 0; fd < maxfd_ && nready > 0; fd++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        Channel *ch = getChannel(fd);
        if (ch == nullptr)
            continue;

        bool flag = false;
        if (FD_ISSET(fd, &eset)) {
            flag = true;
            ch->handleErroEvent();
            continue;
        }
        if (FD_ISSET(fd, &rset)) {
            flag = true;
            ch->handleReadEvent();
        }
        if (FD_ISSET(fd, &wset) && (ch = getChannel(fd)) != nullptr) {
            flag = true;
            ch->handleWritEvent();
        }

        if (flag == true) {
            nready--;
        }
    }

    runAfterLoopHandlers();
}